

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O0

pos_type __thiscall
anon_unknown.dwarf_189523::databuf::seekpos(databuf *this,pos_type pos,openmode mode)

{
  pos_type pVar1;
  _Ios_Openmode _Var2;
  streamoff sVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  _Ios_Openmode in_ECX;
  __mbstate_t in_RDX;
  streamoff in_RSI;
  char *in_RDI;
  streamoff in_stack_ffffffffffffff98;
  fpos<__mbstate_t> *in_stack_ffffffffffffffa0;
  streamoff local_20;
  __mbstate_t local_18;
  streamoff local_10;
  __mbstate_t local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  _Var2 = std::operator&(in_ECX,_S_out);
  if (_Var2 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    _Var2 = std::operator&(in_ECX,_S_in);
    if (_Var2 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      sVar3 = std::fpos::operator_cast_to_long((fpos *)&local_20);
      if (-1 < sVar3) {
        sVar3 = std::fpos::operator_cast_to_long((fpos *)&local_20);
        lVar4 = std::streambuf::egptr();
        lVar5 = std::streambuf::eback();
        if (sVar3 <= lVar4 - lVar5) {
          pcVar6 = (char *)std::streambuf::eback();
          lVar4 = std::streambuf::eback();
          sVar3 = std::fpos::operator_cast_to_long((fpos *)&local_20);
          std::streambuf::egptr();
          std::streambuf::setg(in_RDI,pcVar6,(char *)(lVar4 + sVar3));
          local_10 = local_20;
          local_8 = local_18;
          goto LAB_002037ec;
        }
      }
      std::char_traits<char>::eof();
      std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      goto LAB_002037ec;
    }
  }
  std::char_traits<char>::eof();
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
LAB_002037ec:
  pVar1._M_state = local_8;
  pVar1._M_off = local_10;
  return pVar1;
}

Assistant:

pos_type seekpos(pos_type pos, std::ios_base::openmode mode) override
    {
        // Simplified version of seekoff
        if((mode&std::ios_base::out) || !(mode&std::ios_base::in))
            return traits_type::eof();

        if(pos < 0 || pos > egptr()-eback())
            return traits_type::eof();

        setg(eback(), eback() + static_cast<size_t>(pos), egptr());
        return pos;
    }